

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::unmap(QFSFileEnginePrivate *this,uchar *ptr)

{
  byte bVar1;
  QAbstractFileEngine *this_00;
  Span *pSVar2;
  Entry *pEVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  const_iterator it;
  QArrayDataPointer<char16_t> local_50;
  uchar *ptr_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  ptr_local = ptr;
  it = QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength>::constFindImpl<unsigned_char*>
                 ((QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength> *)&this->maps,
                  &ptr_local);
  if (it.i.d == (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *)
                0x0 && it.i.bucket == 0) {
    qt_error_string((QString *)&local_50,0xd);
    QAbstractFileEngine::setError(this_00,PermissionsError,(QString *)&local_50);
  }
  else {
    pSVar2 = (it.i.d)->spans;
    uVar7 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar7].entries;
    bVar1 = pSVar2[uVar7].offsets[(uint)it.i.bucket & 0x7f];
    iVar5 = munmap(ptr_local + -(long)*(int *)(pEVar3[bVar1].storage.data + 8),
                   *(size_t *)(pEVar3[bVar1].storage.data + 0x10));
    if (iVar5 != -1) {
      QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::erase(&this->maps,it);
      bVar4 = true;
      goto LAB_0037871a;
    }
    piVar6 = __errno_location();
    qt_error_string((QString *)&local_50,*piVar6);
    QAbstractFileEngine::setError(this_00,UnspecifiedError,(QString *)&local_50);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  bVar4 = false;
LAB_0037871a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::unmap(uchar *ptr)
{
#if !defined(Q_OS_INTEGRITY)
    Q_Q(QFSFileEngine);
    const auto it = std::as_const(maps).find(ptr);
    if (it == maps.cend()) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    uchar *start = ptr - it->start;
    size_t len = it->length;
    if (-1 == munmap(start, len)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        return false;
    }
    maps.erase(it);
    return true;
#else
    return false;
#endif
}